

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bluetooth_piconet.c
# Opt level: O0

btbb_piconet * get_piconet(uint32_t lap)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  long lVar4;
  UT_hash_handle *pUVar5;
  uint32_t uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  survey_hash *psVar11;
  UT_hash_table *pUVar12;
  UT_hash_bucket *pUVar13;
  UT_hash_bucket *pUVar14;
  uint local_94;
  UT_hash_bucket *_he_newbkt;
  UT_hash_bucket *_he_new_buckets;
  UT_hash_handle *_he_hh_nxt;
  UT_hash_handle *_he_thh;
  uint _he_bkt_i;
  uint _he_bkt;
  uchar *_hj_key_1;
  uint _hj_k_1;
  uint _hj_j_1;
  uint _hj_i_1;
  uint _ha_bkt;
  uchar *_hj_key;
  uint local_30;
  uint _hj_k;
  uint _hj_j;
  uint _hj_i;
  uint _hf_hashv;
  uint _hf_bkt;
  btbb_piconet *pn;
  survey_hash *s;
  uint32_t lap_local;
  
  pn = (btbb_piconet *)0x0;
  if (piconet_survey != (survey_hash *)0x0) {
    __hj_i_1 = (byte *)((long)&s + 4);
    _hj_j = 0xfeedbeef;
    local_30 = 0x9e3779b9;
    _hj_k = 0x9e3779b9;
    for (_hj_key._4_4_ = 4; 0xb < _hj_key._4_4_; _hj_key._4_4_ = _hj_key._4_4_ - 0xc) {
      iVar7 = (uint)__hj_i_1[4] + (uint)__hj_i_1[5] * 0x100 + (uint)__hj_i_1[6] * 0x10000 +
              (uint)__hj_i_1[7] * 0x1000000 + local_30;
      uVar8 = (uint)__hj_i_1[8] + (uint)__hj_i_1[9] * 0x100 + (uint)__hj_i_1[10] * 0x10000 +
              (uint)__hj_i_1[0xb] * 0x1000000 + _hj_j;
      uVar9 = uVar8 >> 0xd ^
              (((uint)*__hj_i_1 + (uint)__hj_i_1[1] * 0x100 + (uint)__hj_i_1[2] * 0x10000 +
                (uint)__hj_i_1[3] * 0x1000000 + _hj_k) - iVar7) - uVar8;
      uVar10 = uVar9 << 8 ^ (iVar7 - uVar8) - uVar9;
      uVar8 = uVar10 >> 0xd ^ (uVar8 - uVar9) - uVar10;
      uVar9 = uVar8 >> 0xc ^ (uVar9 - uVar10) - uVar8;
      uVar10 = uVar9 << 0x10 ^ (uVar10 - uVar8) - uVar9;
      uVar8 = uVar10 >> 5 ^ (uVar8 - uVar9) - uVar10;
      _hj_k = uVar8 >> 3 ^ (uVar9 - uVar10) - uVar8;
      local_30 = _hj_k << 10 ^ (uVar10 - uVar8) - _hj_k;
      _hj_j = local_30 >> 0xf ^ (uVar8 - _hj_k) - local_30;
      __hj_i_1 = __hj_i_1 + 0xc;
    }
    uVar8 = _hj_j + 4;
    switch(_hj_key._4_4_) {
    case 8:
      local_30 = (uint)__hj_i_1[4] +
                 (uint)__hj_i_1[5] * 0x100 +
                 (uint)__hj_i_1[6] * 0x10000 + (uint)__hj_i_1[7] * 0x1000000 + local_30;
    case 4:
      _hj_k = (uint)*__hj_i_1 +
              (uint)__hj_i_1[1] * 0x100 +
              (uint)__hj_i_1[2] * 0x10000 + (uint)__hj_i_1[3] * 0x1000000 + _hj_k;
    default:
      uVar9 = uVar8 >> 0xd ^ (_hj_k - local_30) - uVar8;
      uVar10 = uVar9 << 8 ^ (local_30 - uVar8) - uVar9;
      uVar8 = uVar10 >> 0xd ^ (uVar8 - uVar9) - uVar10;
      uVar9 = uVar8 >> 0xc ^ (uVar9 - uVar10) - uVar8;
      uVar10 = uVar9 << 0x10 ^ (uVar10 - uVar8) - uVar9;
      uVar8 = uVar10 >> 5 ^ (uVar8 - uVar9) - uVar10;
      uVar9 = uVar8 >> 3 ^ (uVar9 - uVar10) - uVar8;
      uVar10 = uVar9 << 10 ^ (uVar10 - uVar8) - uVar9;
      uVar8 = (uVar10 >> 0xf ^ (uVar8 - uVar9) - uVar10) &
              ((piconet_survey->hh).tbl)->num_buckets - 1;
      if (((piconet_survey->hh).tbl)->buckets[uVar8].hh_head == (UT_hash_handle *)0x0) {
        pn = (btbb_piconet *)0x0;
      }
      else {
        pn = (btbb_piconet *)
             ((long)((piconet_survey->hh).tbl)->buckets[uVar8].hh_head -
             ((piconet_survey->hh).tbl)->hho);
      }
      while ((pn != (btbb_piconet *)0x0 && ((pn->bank[1] != 4 || (**(uint32_t **)&pn->d1 != lap)))))
      {
        lVar4._0_4_ = pn->a1;
        lVar4._4_4_ = pn->c1;
        if (lVar4 == 0) {
          pn = (btbb_piconet *)0x0;
        }
        else {
          pn = (btbb_piconet *)(*(long *)&pn->a1 - ((piconet_survey->hh).tbl)->hho);
        }
      }
    }
  }
  if (pn == (btbb_piconet *)0x0) {
    s._4_4_ = lap;
    __hf_hashv = btbb_piconet_new();
    btbb_init_piconet(__hf_hashv,s._4_4_);
    psVar11 = (survey_hash *)malloc(0x48);
    psVar11->key = s._4_4_;
    psVar11->pn = __hf_hashv;
    (psVar11->hh).next = (void *)0x0;
    (psVar11->hh).key = psVar11;
    (psVar11->hh).keylen = 4;
    if (piconet_survey == (survey_hash *)0x0) {
      piconet_survey = psVar11;
      (psVar11->hh).prev = (void *)0x0;
      pUVar12 = (UT_hash_table *)malloc(0x40);
      (piconet_survey->hh).tbl = pUVar12;
      if ((piconet_survey->hh).tbl == (UT_hash_table *)0x0) {
        exit(-1);
      }
      memset((piconet_survey->hh).tbl,0,0x40);
      ((piconet_survey->hh).tbl)->tail = &piconet_survey->hh;
      ((piconet_survey->hh).tbl)->num_buckets = 0x20;
      ((piconet_survey->hh).tbl)->log2_num_buckets = 5;
      ((piconet_survey->hh).tbl)->hho = 0x10;
      pUVar13 = (UT_hash_bucket *)malloc(0x200);
      ((piconet_survey->hh).tbl)->buckets = pUVar13;
      if (((piconet_survey->hh).tbl)->buckets == (UT_hash_bucket *)0x0) {
        exit(-1);
      }
      memset(((piconet_survey->hh).tbl)->buckets,0,0x200);
      ((piconet_survey->hh).tbl)->signature = 0xa0111fe1;
    }
    else {
      ((piconet_survey->hh).tbl)->tail->next = psVar11;
      (psVar11->hh).prev =
           (void *)((long)((piconet_survey->hh).tbl)->tail - ((piconet_survey->hh).tbl)->hho);
      ((piconet_survey->hh).tbl)->tail = &psVar11->hh;
    }
    pUVar12 = (piconet_survey->hh).tbl;
    pUVar12->num_items = pUVar12->num_items + 1;
    (psVar11->hh).tbl = (piconet_survey->hh).tbl;
    (psVar11->hh).hashv = 0xfeedbeef;
    _hj_key_1._4_4_ = 0x9e3779b9;
    _hj_k_1 = 0x9e3779b9;
    __he_bkt_i = psVar11;
    for (_hj_key_1._0_4_ = 4; 0xb < (uint)_hj_key_1; _hj_key_1._0_4_ = (uint)_hj_key_1 - 0xc) {
      uVar6 = __he_bkt_i->key;
      bVar1 = *(byte *)((long)&__he_bkt_i->key + 1);
      bVar2 = *(byte *)((long)&__he_bkt_i->key + 2);
      bVar3 = *(byte *)((long)&__he_bkt_i->key + 3);
      iVar7 = (uint)(byte)__he_bkt_i->field_0x4 + (uint)(byte)__he_bkt_i->field_0x5 * 0x100 +
              (uint)(byte)__he_bkt_i->field_0x6 * 0x10000 +
              (uint)(byte)__he_bkt_i->field_0x7 * 0x1000000 + _hj_key_1._4_4_;
      (psVar11->hh).hashv =
           (uint)*(byte *)&__he_bkt_i->pn + (uint)*(byte *)((long)&__he_bkt_i->pn + 1) * 0x100 +
           (uint)*(byte *)((long)&__he_bkt_i->pn + 2) * 0x10000 +
           (uint)*(byte *)((long)&__he_bkt_i->pn + 3) * 0x1000000 + (psVar11->hh).hashv;
      uVar8 = (psVar11->hh).hashv >> 0xd ^
              (((uint)(byte)uVar6 + (uint)bVar1 * 0x100 + (uint)bVar2 * 0x10000 +
                (uint)bVar3 * 0x1000000 + _hj_k_1) - iVar7) - (psVar11->hh).hashv;
      uVar9 = uVar8 << 8 ^ (iVar7 - (psVar11->hh).hashv) - uVar8;
      (psVar11->hh).hashv = (psVar11->hh).hashv - uVar8;
      (psVar11->hh).hashv = (psVar11->hh).hashv - uVar9;
      (psVar11->hh).hashv = uVar9 >> 0xd ^ (psVar11->hh).hashv;
      uVar8 = (psVar11->hh).hashv >> 0xc ^ (uVar8 - uVar9) - (psVar11->hh).hashv;
      uVar9 = uVar8 << 0x10 ^ (uVar9 - (psVar11->hh).hashv) - uVar8;
      (psVar11->hh).hashv = (psVar11->hh).hashv - uVar8;
      (psVar11->hh).hashv = (psVar11->hh).hashv - uVar9;
      (psVar11->hh).hashv = uVar9 >> 5 ^ (psVar11->hh).hashv;
      _hj_k_1 = (psVar11->hh).hashv >> 3 ^ (uVar8 - uVar9) - (psVar11->hh).hashv;
      _hj_key_1._4_4_ = _hj_k_1 << 10 ^ (uVar9 - (psVar11->hh).hashv) - _hj_k_1;
      (psVar11->hh).hashv = (psVar11->hh).hashv - _hj_k_1;
      (psVar11->hh).hashv = (psVar11->hh).hashv - _hj_key_1._4_4_;
      (psVar11->hh).hashv = _hj_key_1._4_4_ >> 0xf ^ (psVar11->hh).hashv;
      __he_bkt_i = (survey_hash *)((long)&__he_bkt_i->pn + 4);
    }
    (psVar11->hh).hashv = (psVar11->hh).hashv + 4;
    switch((uint)_hj_key_1) {
    case 8:
      _hj_key_1._4_4_ =
           (uint)(byte)__he_bkt_i->field_0x4 +
           (uint)(byte)__he_bkt_i->field_0x5 * 0x100 +
           (uint)(byte)__he_bkt_i->field_0x6 * 0x10000 +
           (uint)(byte)__he_bkt_i->field_0x7 * 0x1000000 + _hj_key_1._4_4_;
    case 4:
      _hj_k_1 = (uint)(byte)__he_bkt_i->key +
                (uint)*(byte *)((long)&__he_bkt_i->key + 1) * 0x100 +
                (uint)*(byte *)((long)&__he_bkt_i->key + 2) * 0x10000 +
                (uint)*(byte *)((long)&__he_bkt_i->key + 3) * 0x1000000 + _hj_k_1;
    }
    uVar8 = (psVar11->hh).hashv >> 0xd ^ (_hj_k_1 - _hj_key_1._4_4_) - (psVar11->hh).hashv;
    uVar9 = uVar8 << 8 ^ (_hj_key_1._4_4_ - (psVar11->hh).hashv) - uVar8;
    (psVar11->hh).hashv = (psVar11->hh).hashv - uVar8;
    (psVar11->hh).hashv = (psVar11->hh).hashv - uVar9;
    (psVar11->hh).hashv = uVar9 >> 0xd ^ (psVar11->hh).hashv;
    uVar8 = (psVar11->hh).hashv >> 0xc ^ (uVar8 - uVar9) - (psVar11->hh).hashv;
    uVar9 = uVar8 << 0x10 ^ (uVar9 - (psVar11->hh).hashv) - uVar8;
    (psVar11->hh).hashv = (psVar11->hh).hashv - uVar8;
    (psVar11->hh).hashv = (psVar11->hh).hashv - uVar9;
    (psVar11->hh).hashv = uVar9 >> 5 ^ (psVar11->hh).hashv;
    uVar8 = (psVar11->hh).hashv >> 3 ^ (uVar8 - uVar9) - (psVar11->hh).hashv;
    uVar9 = uVar8 << 10 ^ (uVar9 - (psVar11->hh).hashv) - uVar8;
    (psVar11->hh).hashv = (psVar11->hh).hashv - uVar8;
    (psVar11->hh).hashv = (psVar11->hh).hashv - uVar9;
    (psVar11->hh).hashv = uVar9 >> 0xf ^ (psVar11->hh).hashv;
    uVar8 = (psVar11->hh).hashv & ((piconet_survey->hh).tbl)->num_buckets - 1;
    pUVar13 = ((piconet_survey->hh).tbl)->buckets;
    pUVar13[uVar8].count = pUVar13[uVar8].count + 1;
    (psVar11->hh).hh_next = ((piconet_survey->hh).tbl)->buckets[uVar8].hh_head;
    (psVar11->hh).hh_prev = (UT_hash_handle *)0x0;
    if (((piconet_survey->hh).tbl)->buckets[uVar8].hh_head != (UT_hash_handle *)0x0) {
      (((piconet_survey->hh).tbl)->buckets[uVar8].hh_head)->hh_prev = &psVar11->hh;
    }
    ((piconet_survey->hh).tbl)->buckets[uVar8].hh_head = &psVar11->hh;
    if (((((piconet_survey->hh).tbl)->buckets[uVar8].expand_mult + 1) * 10 <=
         ((piconet_survey->hh).tbl)->buckets[uVar8].count) && (((psVar11->hh).tbl)->noexpand != 1))
    {
      pUVar13 = (UT_hash_bucket *)malloc((ulong)(((psVar11->hh).tbl)->num_buckets << 1) << 4);
      if (pUVar13 == (UT_hash_bucket *)0x0) {
        exit(-1);
      }
      memset(pUVar13,0,(ulong)(((psVar11->hh).tbl)->num_buckets << 1) << 4);
      ((psVar11->hh).tbl)->ideal_chain_maxlen =
           (((psVar11->hh).tbl)->num_items >>
           ((char)((psVar11->hh).tbl)->log2_num_buckets + 1U & 0x1f)) +
           (uint)((((psVar11->hh).tbl)->num_items & ((psVar11->hh).tbl)->num_buckets * 2 - 1) != 0);
      ((psVar11->hh).tbl)->nonideal_items = 0;
      for (_he_thh._0_4_ = 0; (uint)_he_thh < ((psVar11->hh).tbl)->num_buckets;
          _he_thh._0_4_ = (uint)_he_thh + 1) {
        _he_hh_nxt = ((psVar11->hh).tbl)->buckets[(uint)_he_thh].hh_head;
        while (_he_hh_nxt != (UT_hash_handle *)0x0) {
          pUVar5 = _he_hh_nxt->hh_next;
          pUVar14 = pUVar13 + (_he_hh_nxt->hashv & ((psVar11->hh).tbl)->num_buckets * 2 - 1);
          uVar8 = pUVar14->count + 1;
          pUVar14->count = uVar8;
          if (((psVar11->hh).tbl)->ideal_chain_maxlen < uVar8) {
            pUVar12 = (psVar11->hh).tbl;
            pUVar12->nonideal_items = pUVar12->nonideal_items + 1;
            pUVar14->expand_mult = pUVar14->count / ((psVar11->hh).tbl)->ideal_chain_maxlen;
          }
          _he_hh_nxt->hh_prev = (UT_hash_handle *)0x0;
          _he_hh_nxt->hh_next = pUVar14->hh_head;
          if (pUVar14->hh_head != (UT_hash_handle *)0x0) {
            pUVar14->hh_head->hh_prev = _he_hh_nxt;
          }
          pUVar14->hh_head = _he_hh_nxt;
          _he_hh_nxt = pUVar5;
        }
      }
      free(((psVar11->hh).tbl)->buckets);
      pUVar12 = (psVar11->hh).tbl;
      pUVar12->num_buckets = pUVar12->num_buckets << 1;
      pUVar12 = (psVar11->hh).tbl;
      pUVar12->log2_num_buckets = pUVar12->log2_num_buckets + 1;
      ((psVar11->hh).tbl)->buckets = pUVar13;
      if (((psVar11->hh).tbl)->num_items >> 1 < ((psVar11->hh).tbl)->nonideal_items) {
        local_94 = ((psVar11->hh).tbl)->ineff_expands + 1;
      }
      else {
        local_94 = 0;
      }
      ((psVar11->hh).tbl)->ineff_expands = local_94;
      if (1 < ((psVar11->hh).tbl)->ineff_expands) {
        ((psVar11->hh).tbl)->noexpand = 1;
      }
    }
  }
  else {
    __hf_hashv = *(btbb_piconet **)&pn->aliased;
  }
  return __hf_hashv;
}

Assistant:

btbb_piconet *get_piconet(uint32_t lap)
{
	survey_hash *s;
	btbb_piconet *pn;
	HASH_FIND(hh, piconet_survey, &lap, 4, s);

	if (s == NULL) {
		pn = btbb_piconet_new();
		btbb_init_piconet(pn, lap);

		s = malloc(sizeof(survey_hash));
		s->key = lap;
		s->pn = pn;
		HASH_ADD(hh, piconet_survey, key, 4, s);
	} else {
		pn = s->pn;
	}
	return pn;
}